

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  CURLcode CVar1;
  
  if (((data->conn->bits).field_0x3 & 2) == 0) {
    CVar1 = Curl_resolver_is_resolved(data,dns);
  }
  else {
    CVar1 = Curl_doh_is_resolved(data,dns);
  }
  if (*dns != (Curl_dns_entry *)0x0) {
    show_resolve_info(data,*dns);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
  CURLcode result;
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)data;
  (void)dns;
#endif
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh) {
    result = Curl_doh_is_resolved(data, dns);
  }
  else
#endif
  result = Curl_resolver_is_resolved(data, dns);
  if(*dns)
    show_resolve_info(data, *dns);
  return result;
}